

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

bool __thiscall mcsFile::ProcessNextLine(mcsFile *this,RecInfo *rec)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  char cVar5;
  mcsFile *this_00;
  char *p2;
  uint i;
  ulong uVar6;
  uchar *result;
  uchar cksum;
  uchar addr_low;
  uchar addr_high;
  char buffer [64];
  
  this_00 = this;
  std::istream::getline((char *)this,(long)buffer);
  this->line_num = this->line_num + 1;
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    return false;
  }
  if (buffer[0] != ':') {
    return false;
  }
  iVar2 = *(int *)&this->field_0x8;
  if (iVar2 < 0x40) {
    bVar3 = toHex(this_00,buffer + 1,&rec->ndata);
    if (!bVar3) {
      return false;
    }
    bVar1 = rec->ndata;
    if (bVar1 < 0x11) {
      bVar3 = toHex(this_00,buffer + 3,&addr_high);
      if (!bVar3) {
        return false;
      }
      bVar3 = toHex(this_00,buffer + 5,&addr_low);
      if (!bVar3) {
        return false;
      }
      rec->addr = CONCAT11(addr_high,addr_low);
      bVar3 = toHex(this_00,buffer + 7,&rec->type);
      if (!bVar3) {
        return false;
      }
      cVar5 = addr_high + bVar1 + addr_low + rec->type;
      p2 = buffer + 9;
      result = rec->data;
      for (uVar6 = 0; uVar6 < rec->ndata; uVar6 = uVar6 + 1) {
        bVar3 = toHex(this_00,p2,result);
        if (!bVar3) {
          return false;
        }
        cVar5 = cVar5 + *result;
        p2 = p2 + 2;
        result = result + 1;
      }
      bVar3 = toHex(this_00,buffer + (ulong)rec->ndata * 2 + 9,&cksum);
      if (!bVar3) {
        return false;
      }
      if ((uchar)(cVar5 + cksum) == '\0') {
        return true;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->line_num);
      poVar4 = std::operator<<(poVar4," checksum error = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->line_num);
      poVar4 = std::operator<<(poVar4," has too much data, num bytes = ");
      poVar4 = std::operator<<(poVar4,rec->ndata);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->line_num);
    poVar4 = std::operator<<(poVar4," has too many characters, nbytes = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool mcsFile::ProcessNextLine(RecInfo &rec)
{
    // MCS file generated by ISE has line lengths no larger than 43 bytes
    const int MCS_LINE_MAX = 64;
    char buffer[MCS_LINE_MAX];

    file.getline(buffer, sizeof(buffer));
    line_num++;
    if (file.eof()) return false;

    if (buffer[0] != ':') return false;
    int nbytes = static_cast<int>(file.gcount());
    if (nbytes >= MCS_LINE_MAX) {
        // If this error occurs, increase MCS_LINE_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too many characters, nbytes = " << nbytes << std::endl;
        return false;
    }
    if (!buffer[nbytes-1]) nbytes--;

    unsigned long csum_computed = 0L;
    if (!toHex(buffer+1, rec.ndata)) return false;
    csum_computed += rec.ndata;
    if (rec.ndata > sizeof(rec.data)) {
        // If this error occurs, increase RecInfo::DATA_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too much data, num bytes = " << rec.ndata << std::endl;
        return false;
    }
    unsigned char addr_high, addr_low;
    if (!toHex(buffer+3, addr_high)) return false;
    csum_computed += addr_high;
    if (!toHex(buffer+5, addr_low)) return false;
    csum_computed += addr_low;
    rec.addr = (addr_high<<8)+addr_low;
    if (!toHex(buffer+7, rec.type)) return false;
    csum_computed += rec.type;

    // convert to binary and compute checksum
    for (unsigned int i = 0; i < rec.ndata; i++) {
        if (!toHex(buffer+9+2*i, rec.data[i])) return false;
        csum_computed += rec.data[i];
    }
    unsigned char cksum;
    if (!toHex(buffer+9+2*rec.ndata, cksum)) return false;
    csum_computed += cksum;
    
    csum_computed &= 0x000000ff;
    if (csum_computed) {
        std::cerr << "ProcessNextLine: line " << line_num
                  << " checksum error = " << csum_computed << std::endl;
        return false;
    }
    return true;
}